

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfMapNamedBuffer(ErrorsTest *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  uint *puVar7;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  undefined4 *puVar8;
  MessageBuilder local_1d0;
  void *local_50;
  GLbyte *subsequent_mapped_data;
  GLbyte *mapped_data;
  GLuint local_38;
  GLenum invalid_access_flags;
  GLuint not_a_buffer_name;
  undefined4 local_24;
  GLuint local_20;
  GLubyte dummy_data [4];
  GLuint buffer;
  bool internal_error;
  bool is_ok;
  Functions *gl;
  ErrorsTest *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  dummy_data[3] = '\x01';
  dummy_data[2] = '\0';
  local_20 = 0;
  local_24 = 0;
  (**(code **)(lVar6 + 0x3b8))(1,&local_20);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xf9d);
  (*this->m_pNamedBufferStorage)(local_20,4,&local_24,0x41);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glNamedBuffeStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,4000);
  local_38 = 0;
  do {
    local_38 = local_38 + 1;
    cVar1 = (**(code **)(lVar6 + 0xc68))();
  } while (cVar1 != '\0');
  (*this->m_pMapNamedBuffer)(local_38,35000);
  bVar2 = ErrorCheckAndLog(this,"glMapNamedBuffer",0x502,
                           " if buffer is not the name of an existing buffer object.");
  dummy_data[3] = (dummy_data[3] & 1 & bVar2) != 0;
  mapped_data._4_4_ = 0;
  do {
    mapped_data._4_4_ = mapped_data._4_4_ + 1;
    puVar7 = std::find<unsigned_int_const*,unsigned_int>
                       (TestErrorsOfMapNamedBuffer::valid_access_flags,
                        TestErrorsOfMapNamedBuffer::valid_access_flags + 3,
                        (uint *)((long)&mapped_data + 4));
  } while (puVar7 != TestErrorsOfMapNamedBuffer::valid_access_flags + 3);
  subsequent_mapped_data = (GLbyte *)(*this->m_pMapNamedBuffer)(local_20,mapped_data._4_4_);
  bVar2 = ErrorCheckAndLog(this,"glMapNamedBuffer",0x500,
                           " if access is not READ_ONLY, WRITE_ONLY, or READ_WRITE.");
  dummy_data[3] = (dummy_data[3] & 1 & bVar2) != 0;
  if (subsequent_mapped_data != (GLbyte *)0x0) {
    (*this->m_pUnmapNamedBuffer)(local_20);
    do {
      iVar3 = (**(code **)(lVar6 + 0x800))();
    } while (iVar3 != 0);
  }
  (*this->m_pMapNamedBuffer)(local_20,35000);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glMapNamedBuffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xfd1);
  local_50 = (*this->m_pMapNamedBuffer)(local_20,35000);
  bVar2 = ErrorCheckAndLog(this,"glMapNamedBuffer",0x502,
                           " if the buffer object is in a mapped state.");
  dummy_data[3] = bVar2 & dummy_data[3];
  (*this->m_pUnmapNamedBuffer)(local_20);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xfd9);
  if (local_50 == (void *)0x0) {
    if (local_20 != 0) {
      (**(code **)(lVar6 + 0x438))(1,&local_20);
      local_20 = 0;
    }
    if ((dummy_data[2] & 1) == 0) {
      return (bool)(dummy_data[3] & 1);
    }
    puVar8 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar8 = 0;
    __cxa_throw(puVar8,&int::typeinfo,0);
  }
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_1d0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  this_02 = tcu::MessageBuilder::operator<<
                      (&local_1d0,
                       (char (*) [208])
                       "glMapNamedBuffer called on mapped buffer returned non-NULL pointer when error shall occure.This may lead to undefined behavior during next tests (object still may be mapped). Test was terminated prematurely."
                      );
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  puVar8 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar8 = 0;
  __cxa_throw(puVar8,&int::typeinfo,0);
}

Assistant:

bool ErrorsTest::TestErrorsOfMapNamedBuffer()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint  buffer		   = 0;
	glw::GLubyte dummy_data[4] = {};

	try
	{
		/* Common preparations. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(buffer, sizeof(dummy_data), &dummy_data, GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

		/* Test invalid buffer name error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			/* Test. */
			m_pMapNamedBuffer(not_a_buffer_name, GL_READ_ONLY);

			is_ok &= ErrorCheckAndLog("glMapNamedBuffer", GL_INVALID_OPERATION,
									  " if buffer is not the name of an existing buffer object.");
		}

		/* Test access flag error behavior. */
		{
			/* Prepare for invalid type error behavior verification. */
			static const glw::GLenum valid_access_flags[] = { GL_READ_ONLY, GL_WRITE_ONLY, GL_READ_WRITE, GL_NONE };
			static const glw::GLenum valid_access_flags_last =
				sizeof(valid_access_flags) / sizeof(valid_access_flags[0]) - 1;

			glw::GLenum invalid_access_flags = 0;

			while (&valid_access_flags[valid_access_flags_last] !=
				   std::find(&valid_access_flags[0], &valid_access_flags[valid_access_flags_last],
							 (++invalid_access_flags)))
				;

			/* Test. */
			glw::GLbyte* mapped_data = (glw::GLbyte*)m_pMapNamedBuffer(buffer, invalid_access_flags);

			is_ok &= ErrorCheckAndLog("glMapNamedBuffer", GL_INVALID_ENUM,
									  " if access is not READ_ONLY, WRITE_ONLY, or READ_WRITE.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test mapping of mapped buffer error behavior. */
		{
			(void)(glw::GLbyte*) m_pMapNamedBuffer(buffer, GL_READ_ONLY);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer.");

			glw::GLbyte* subsequent_mapped_data = (glw::GLbyte*)m_pMapNamedBuffer(buffer, GL_READ_ONLY);

			is_ok &= ErrorCheckAndLog("glMapNamedBuffer", GL_INVALID_OPERATION,
									  " if the buffer object is in a mapped state.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");

			if (subsequent_mapped_data)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "glMapNamedBuffer called on mapped buffer returned non-NULL pointer when error shall occure."
					   "This may lead to undefined behavior during next tests (object still may be mapped). "
					   "Test was terminated prematurely."
					<< tcu::TestLog::EndMessage;
				throw 0;
			}
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}